

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

size_t nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
       ::extra_space(string_t *s)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  char *c;
  const_iterator __end0;
  const_iterator __begin0;
  string_t *__range2;
  size_t result;
  string_t *s_local;
  
  __range2 = (string_t *)0x0;
  __end0._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end0);
    iVar2 = (int)*pcVar3;
    if ((((iVar2 - 8U < 3) || (iVar2 - 0xcU < 2)) || (iVar2 == 0x22)) || (iVar2 == 0x5c)) {
      __range2 = __range2 + 1;
    }
    else if ((-1 < *pcVar3) && (*pcVar3 < ' ')) {
      __range2 = __range2 + 5;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end0);
  }
  return (size_t)__range2;
}

Assistant:

static std::size_t extra_space(const string_t& s) noexcept
        {
            std::size_t result = 0;

            for (const auto& c : s)
            {
                switch (c)
                {
                    case '"':
                    case '\\':
                    case '\b':
                    case '\f':
                    case '\n':
                    case '\r':
                    case '\t':
                    {
                        // from c (1 byte) to \x (2 bytes)
                        result += 1;
                        break;
                    }

                    default:
                    {
                        if (c >= 0x00 and c <= 0x1f)
                        {
                            // from c (1 byte) to \uxxxx (6 bytes)
                            result += 5;
                        }
                        break;
                    }
                }
            }

            return result;
        }